

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueue_Catches_Failure::test_method
          (test_CheckQueue_Catches_Failure *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool success;
  size_t k;
  size_t r;
  size_t remaining;
  size_t i;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object fail_queue;
  CCheckQueueControl<FailingCheck> control;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  lazy_ostream *in_stack_fffffffffffffe50;
  const_string *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  lazy_ostream *in_stack_fffffffffffffe68;
  const_string *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  ulong local_168;
  ulong local_158;
  ulong local_140;
  const_string local_130 [2];
  lazy_ostream local_110 [2];
  assertion_result local_f0 [2];
  assertion_result local_78 [2];
  undefined1 local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FailingCheck>,unsigned_int_const&,int_const&>
            ((uint *)in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
  for (local_140 = 0; local_140 < 0x3e9; local_140 = local_140 + 1) {
    std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
    get((unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_> *)
        in_stack_fffffffffffffe38);
    CCheckQueueControl<FailingCheck>::CCheckQueueControl
              ((CCheckQueueControl<FailingCheck> *)
               CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (CCheckQueue<FakeCheckCheckCompletion> *)
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_158 = local_140;
    while (local_158 != 0) {
      iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                         (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffffe38);
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::reserve
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                 (size_type)in_stack_fffffffffffffe70);
      for (local_168 = 0;
          in_stack_fffffffffffffe7f = local_168 < (ulong)(long)iVar2 && local_158 != 0,
          local_168 < (ulong)(long)iVar2 && local_158 != 0; local_168 = local_168 + 1) {
        local_39 = local_158 == 1;
        std::vector<FailingCheck,_std::allocator<FailingCheck>_>::emplace_back<bool>
                  ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                   in_stack_fffffffffffffe58,(bool *)in_stack_fffffffffffffe50);
        local_158 = local_158 - 1;
      }
      CCheckQueueControl<FailingCheck>::Add
                ((CCheckQueueControl<FailingCheck> *)
                 CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::~vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    }
    in_stack_fffffffffffffe7e =
         CCheckQueueControl<FailingCheck>::Wait
                   ((CCheckQueueControl<FailingCheck> *)in_stack_fffffffffffffe50);
    if (local_140 == 0) {
      do {
        in_stack_fffffffffffffe58 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (unsigned_long)in_stack_fffffffffffffe38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)
                   CONCAT17(in_stack_fffffffffffffe7f,
                            CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                   in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                   (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
                   ,(bool)in_stack_fffffffffffffe47);
        in_stack_fffffffffffffe50 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (unsigned_long)in_stack_fffffffffffffe38);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffe38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (unsigned_long)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe38 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_f0,local_110,local_130,0xf0,REQUIRE,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffe38);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe4f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffe4f);
    }
    else {
      do {
        in_stack_fffffffffffffe70 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (unsigned_long)in_stack_fffffffffffffe38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)
                   CONCAT17(in_stack_fffffffffffffe7f,
                            CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                   in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                   (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
                   ,(bool)in_stack_fffffffffffffe47);
        in_stack_fffffffffffffe68 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (unsigned_long)in_stack_fffffffffffffe38);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffe38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (pointer)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   (unsigned_long)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe38 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_78,(lazy_ostream *)&stack0xffffffffffffff68,
                   (const_string *)&stack0xffffffffffffff48,0xee,REQUIRE,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffe38);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe67 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffe67);
    }
    CCheckQueueControl<FailingCheck>::~CCheckQueueControl
              ((CCheckQueueControl<FailingCheck> *)
               CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  }
  std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>
               *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Catches_Failure)
{
    auto fail_queue = std::make_unique<Failing_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (size_t i = 0; i < 1001; ++i) {
        CCheckQueueControl<FailingCheck> control(fail_queue.get());
        size_t remaining = i;
        while (remaining) {
            size_t r = m_rng.randrange(10);

            std::vector<FailingCheck> vChecks;
            vChecks.reserve(r);
            for (size_t k = 0; k < r && remaining; k++, remaining--)
                vChecks.emplace_back(remaining == 1);
            control.Add(std::move(vChecks));
        }
        bool success = control.Wait();
        if (i > 0) {
            BOOST_REQUIRE(!success);
        } else if (i == 0) {
            BOOST_REQUIRE(success);
        }
    }
}